

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha2.cpp
# Opt level: O2

void sha256_ez(char *hash,char *data,size_t len)

{
  uchar *puVar1;
  long lVar2;
  uchar hval [32];
  sha256_ctx ctx;
  uchar local_a8 [40];
  sha256_ctx local_80;
  
  puVar1 = local_a8;
  local_80.count[0] = 0;
  local_80.count[1] = 0;
  local_80.hash[0] = 0x6a09e667;
  local_80.hash[1] = 0xbb67ae85;
  local_80.hash[2] = 0x3c6ef372;
  local_80.hash[3] = 0xa54ff53a;
  local_80.hash[4] = 0x510e527f;
  local_80.hash[5] = 0x9b05688c;
  local_80.hash[6] = 0x1f83d9ab;
  local_80.hash[7] = 0x5be0cd19;
  sha256_hash((uchar *)data,len,&local_80);
  sha256_end(local_a8,&local_80);
  for (lVar2 = 0; lVar2 != 0x40; lVar2 = lVar2 + 2) {
    byte_to_xdigits(hash + lVar2,*puVar1);
    puVar1 = puVar1 + 1;
  }
  hash[0x40] = '\0';
  return;
}

Assistant:

void sha256_ez(char *hash, const char *data, size_t len)
{
    sha256_ctx ctx;
    const int HASH_BYTES = 32;
    unsigned char hval[HASH_BYTES];

    /* calculate the hash in binary format */
    sha256_begin(&ctx);
    sha256_hash((const unsigned char *)data, len, &ctx);
    sha256_end(hval, &ctx);

    /* convert the binary hash to printable hex digits */
    for (int i = 0 ; i < HASH_BYTES ; ++i, hash += 2)
        byte_to_xdigits(hash, hval[i]);

    /* null-terminate the string */
    *hash = '\0';
}